

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.cpp
# Opt level: O2

size_t __thiscall soul::Structure::getMemberIndex(Structure *this,string_view memberName)

{
  const_iterator cVar1;
  allocator<char> local_41;
  key_type local_40;
  string_view memberName_local;
  
  memberName_local._M_str = memberName._M_str;
  memberName_local._M_len = memberName._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&memberName_local,&local_41);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->memberIndexMap)._M_h,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(size_t *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                   ._M_cur + 0x28);
  }
  throwInternalCompilerError("getMemberIndex",0x4d);
}

Assistant:

size_t Structure::getMemberIndex (std::string_view memberName) const
{
    auto i = memberIndexMap.find (std::string (memberName));

    if (i != memberIndexMap.end())
        return i->second;

    SOUL_ASSERT_FALSE;
    return 0;
}